

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

void __thiscall
features::Sift::orientation_assignment
          (Sift *this,Keypoint *kp,Octave *octave,
          vector<float,_std::allocator<float>_> *orientations)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  iterator __position;
  undefined1 auVar4 [16];
  int i;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  float *pfVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_118 [2];
  float hist [36];
  float local_70;
  float local_6c;
  float o;
  uint local_64;
  float local_60;
  int local_5c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  int local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  memset(local_118,0,0x90);
  local_40 = kp->x + 0.5;
  local_38 = kp->y + 0.5;
  local_3c = kp->sample;
  if (local_3c <= 0.0) {
    fVar14 = ceilf(local_3c + -0.5);
  }
  else {
    fVar14 = floorf(local_3c + 0.5);
  }
  local_34 = (this->options).base_blur_sigma;
  fVar15 = exp2f((local_3c + 1.0) / (float)(this->options).num_samples_per_octave);
  lVar10 = (long)(int)fVar14 + 1;
  psVar1 = (octave->grad).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = psVar1[lVar10].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = psVar1[lVar10].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  iVar5 = (int)local_40;
  psVar1 = (octave->ori).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = psVar1[lVar10].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50 = psVar1[lVar10].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  fVar15 = local_34 * fVar15 * 1.5;
  fVar14 = (float)(int)(fVar15 * 3.0);
  if (((int)fVar14 <= iVar5) &&
     (local_44 = *(int *)((long)&peVar2->super_TypedImageBase<float> + 8),
     (int)fVar14 + iVar5 < local_44)) {
    iVar9 = (int)local_38;
    if (((int)fVar14 <= iVar9) &&
       ((int)fVar14 + iVar9 < *(int *)((long)&peVar2->super_TypedImageBase<float> + 0xc))) {
      if (-1 < (int)fVar14) {
        fVar17 = (float)((int)fVar14 * (int)fVar14) + 0.5;
        uVar11 = -(int)fVar14;
        fVar18 = (float)iVar5 - kp->x;
        local_60 = (float)iVar9 - kp->y;
        o = (fVar15 + fVar15) * fVar15;
        iVar5 = (iVar9 - (int)fVar14) * local_44 + iVar5;
        local_5c = (int)fVar14 * 2 + 1;
        local_64 = uVar11;
        local_38 = fVar17;
        local_6c = fVar18;
        do {
          hist[0x22] = (float)(int)(ulong)uVar11;
          hist[0x23] = (float)(int)((ulong)uVar11 >> 0x20);
          fVar15 = ((float)(int)uVar11 + local_60) * ((float)(int)uVar11 + local_60);
          local_3c = fVar15;
          uVar11 = local_64;
          iVar9 = local_5c;
          do {
            fVar16 = ((float)(int)uVar11 + fVar18) * ((float)(int)uVar11 + fVar18) + fVar15;
            if (fVar16 <= fVar17) {
              local_34 = *(float *)(*(long *)&((ImageData *)
                                              ((long)&peVar2->super_TypedImageBase<float> + 0x18))->
                                              super__Vector_base<float,_std::allocator<float>_> +
                                   (long)(int)(iVar5 + uVar11) * 4);
              local_40 = *(float *)(*(long *)&((ImageData *)
                                              ((long)&peVar3->super_TypedImageBase<float> + 0x18))->
                                              super__Vector_base<float,_std::allocator<float>_> +
                                   (long)(int)(iVar5 + uVar11) * 4);
              fVar16 = expf(-fVar16 / o);
              fVar17 = local_38;
              fVar15 = local_3c;
              fVar18 = local_6c;
              uVar6 = (uint)((local_40 * 36.0) / 6.2831855);
              if (0x22 < (int)uVar6) {
                uVar6 = 0x23;
              }
              uVar7 = (ulong)uVar6;
              if ((int)uVar6 < 1) {
                uVar7 = 0;
              }
              local_118[uVar7] = fVar16 * local_34 + local_118[uVar7];
            }
            uVar11 = uVar11 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
          uVar11 = (int)(float)hist._136_8_ + 1;
          iVar5 = iVar5 + local_44;
        } while ((float)hist._136_8_ != fVar14);
      }
      iVar5 = 0;
      pfVar12 = local_118;
      do {
        fVar14 = local_118[0];
        lVar10 = 0;
        fVar15 = hist[0x21];
        do {
          fVar18 = local_118[lVar10];
          local_118[lVar10] = (fVar15 + fVar18 + hist[lVar10 + -1]) / 3.0;
          lVar10 = lVar10 + 1;
          fVar15 = fVar18;
        } while (lVar10 != 0x23);
        hist[0x21] = (fVar14 + fVar18 + hist[0x21]) / 3.0;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 6);
      lVar10 = 4;
      do {
        if (*pfVar12 <= *(float *)((long)local_118 + lVar10) &&
            *(float *)((long)local_118 + lVar10) != *pfVar12) {
          pfVar12 = (float *)((long)local_118 + lVar10);
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x90);
      local_34 = *pfVar12 * 0.8;
      uVar7 = 0x23;
      lVar10 = 0;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar7;
        lVar13 = lVar10 + 1;
        lVar8 = 0;
        if (lVar10 != 0x23) {
          lVar8 = lVar13;
        }
        fVar14 = local_118[lVar10];
        if (((local_34 < fVar14) &&
            (fVar15 = *(float *)((long)hist +
                                lVar10 * 4 +
                                (SUB168(auVar4 * ZEXT816(0xe38e38e38e38e38f),8) >> 1 &
                                0xfffffffffffffff0) * -9 + 0x84), fVar15 < fVar14)) &&
           (fVar18 = local_118[lVar8], fVar18 < fVar14)) {
          local_70 = ((((float)(int)lVar10 -
                       ((fVar18 - fVar15) * 0.5) / ((fVar15 - (fVar14 + fVar14)) + fVar18)) + 0.5) *
                     6.2831855) / 36.0;
          __position._M_current =
               (orientations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (orientations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)orientations,__position,&local_70);
          }
          else {
            *__position._M_current = local_70;
            (orientations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        uVar7 = uVar7 + 1;
        lVar10 = lVar13;
      } while (lVar13 != 0x24);
    }
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void
Sift::orientation_assignment (Keypoint const& kp,
    Octave const* octave, std::vector<float>& orientations)
{
    int const nbins = 36;
    float const nbinsf = static_cast<float>(nbins);

    /* Prepare 36-bin histogram. */
    float hist[nbins];
    std::fill(hist, hist + nbins, 0.0f);

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /*
     * Compute window size 'win', the full window has  2 * win + 1  pixel.
     * The factor 3 makes the window large enough such that the gaussian
     * has very little weight beyond the window. The value 1.5 is from
     * the SIFT paper. If the window goes beyond the image boundaries,
     * the keypoint is discarded.
     */
    float const sigma_factor = 1.5f;
    int win = static_cast<int>(sigma * sigma_factor * 3.0f);
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return;

    /* Center of keypoint index. */
    int center = iy * width + ix;
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const maxdist = static_cast<float>(win*win) + 0.5f;

    /* Populate histogram over window, intersected with (1,1), (w-2,h-2). */
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Limit to circular window (centered at accurate keypoint). */
            float const dist = MATH_POW2(dx-dxf) + MATH_POW2(dy-dyf);
            if (dist > maxdist)
                continue;

            float gm = grad->at(center + yoff + dx); // gradient magnitude
            float go = ori->at(center + yoff + dx); // gradient orientation
            float weight = math::gaussian_xx(dist, sigma * sigma_factor);
            int bin = static_cast<int>(nbinsf * go / (2.0f * MATH_PI));
            bin = math::clamp(bin, 0, nbins - 1);
            hist[bin] += gm * weight;
        }
    }

    /* Smooth histogram. */
    for (int i = 0; i < 6; ++i)
    {
        float first = hist[0];
        float prev = hist[nbins - 1];
        for (int j = 0; j < nbins - 1; ++j)
        {
            float current = hist[j];
            hist[j] = (prev + current + hist[j + 1]) / 3.0f;
            prev = current;
        }
        hist[nbins - 1] = (prev + hist[nbins - 1] + first) / 3.0f;
    }

    /* Find maximum element. */
    float maxh = *std::max_element(hist, hist + nbins);

    /* Find peaks within 80% of max element. */
    for (int i = 0; i < nbins; ++i)
    {
        float h0 = hist[(i + nbins - 1) % nbins];
        float h1 = hist[i];
        float h2 = hist[(i + 1) % nbins];

        /* These peaks must be a local maximum! */
        if (h1 <= 0.8f * maxh || h1 <= h0 || h1 <= h2)
            continue;

        /*
         * Quadratic interpolation to find accurate maximum.
         * f(x) = ax^2 + bx + c, f(-1) = h0, f(0) = h1, f(1) = h2
         * --> a = 1/2 (h0 - 2h1 + h2), b = 1/2 (h2 - h0), c = h1.
         * x = f'(x) = 2ax + b = 0 --> x = -1/2 * (h2 - h0) / (h0 - 2h1 + h2)
         */
        float x = -0.5f * (h2 - h0) / (h0 - 2.0f * h1 + h2);
        float o =  2.0f * MATH_PI * (x + (float)i + 0.5f) / nbinsf;
        orientations.push_back(o);
    }
}